

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprCodeGetColumnOfTable(Vdbe *v,Table *pTab,int iTabCur,int iCol,int regOut)

{
  Expr *pExpr;
  sqlite3 *db;
  Op *pOVar1;
  Index *pIVar2;
  short *psVar3;
  int iVar4;
  int p2;
  int p3;
  long lVar5;
  bool bVar6;
  sqlite3_value *pValue;
  sqlite3_value *local_30;
  
  if (pTab == (Table *)0x0) {
    iVar4 = 0x5a;
LAB_0016d2aa:
    sqlite3VdbeAddOp3(v,iVar4,iTabCur,iCol,regOut);
    return;
  }
  if ((iCol < 0) || (pTab->iPKey == iCol)) {
    iVar4 = 0x80;
    p2 = regOut;
    p3 = 0;
  }
  else {
    bVar6 = pTab->nModuleArg != 0;
    iVar4 = 0x5a;
    if (bVar6) {
      iVar4 = 0xa4;
    }
    p2 = iCol;
    p3 = regOut;
    if ((pTab->tabFlags & 0x20) != 0 && !bVar6) {
      for (pIVar2 = pTab->pIndex;
          (pIVar2 != (Index *)0x0 && ((*(ushort *)&pIVar2->field_0x63 & 3) != 2));
          pIVar2 = pIVar2->pNext) {
      }
      p2 = -1;
      if (pIVar2->nColumn != 0) {
        psVar3 = pIVar2->aiColumn;
        lVar5 = 0;
        do {
          if (*psVar3 == (short)iCol) {
            p2 = (int)lVar5 >> 0x10;
            break;
          }
          lVar5 = lVar5 + 0x10000;
          psVar3 = psVar3 + 1;
        } while ((ulong)pIVar2->nColumn * 0x10000 != lVar5);
      }
    }
  }
  sqlite3VdbeAddOp3(v,iVar4,iTabCur,p2,p3);
  if (-1 < iCol) {
    if (pTab->pSelect == (Select *)0x0) {
      local_30 = (Mem *)0x0;
      pExpr = pTab->aCol[(uint)iCol].pDflt;
      if (pExpr != (Expr *)0x0) {
        valueFromExpr(v->db,pExpr,v->db->enc,pTab->aCol[(uint)iCol].affinity,&local_30,
                      (ValueNewStat4Ctx *)0x0);
      }
      if (local_30 != (Mem *)0x0) {
        db = v->db;
        if (db->mallocFailed == '\0') {
          pOVar1 = v->aOp;
          iVar4 = v->nOp;
          pOVar1[(long)iVar4 + -1].p4type = -0xb;
          pOVar1[(long)iVar4 + -1].p4.pMem = local_30;
        }
        else if (db->pnBytesFreed == (int *)0x0) {
          sqlite3ValueFree(local_30);
        }
        else {
          freeP4Mem(db,local_30);
        }
      }
    }
    if (pTab->aCol[(uint)iCol].affinity == 'E') {
      iVar4 = 0x54;
      iCol = 0;
      iTabCur = regOut;
      regOut = 0;
      goto LAB_0016d2aa;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeGetColumnOfTable(
  Vdbe *v,        /* The VDBE under construction */
  Table *pTab,    /* The table containing the value */
  int iTabCur,    /* The table cursor.  Or the PK cursor for WITHOUT ROWID */
  int iCol,       /* Index of the column to extract */
  int regOut      /* Extract the value into this register */
){
  if( pTab==0 ){
    sqlite3VdbeAddOp3(v, OP_Column, iTabCur, iCol, regOut);
    return;
  }
  if( iCol<0 || iCol==pTab->iPKey ){
    sqlite3VdbeAddOp2(v, OP_Rowid, iTabCur, regOut);
  }else{
    int op = IsVirtual(pTab) ? OP_VColumn : OP_Column;
    int x = iCol;
    if( !HasRowid(pTab) && !IsVirtual(pTab) ){
      x = sqlite3ColumnOfIndex(sqlite3PrimaryKeyIndex(pTab), iCol);
    }
    sqlite3VdbeAddOp3(v, op, iTabCur, x, regOut);
  }
  if( iCol>=0 ){
    sqlite3ColumnDefault(v, pTab, iCol, regOut);
  }
}